

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::DtlsSession::GetStateString_abi_cxx11_
          (string *__return_storage_ptr__,DtlsSession *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"UNKNOWN","");
  if ((ulong)this->mState < 4) {
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)(&DAT_00236484 + *(int *)(&DAT_00236484 + (ulong)this->mState * 4)));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DtlsSession::GetStateString() const
{
    std::string stateString = "UNKNOWN";
    switch (mState)
    {
    case State::kOpen:
        stateString = "OPEN";
        break;
    case State::kConnecting:
        stateString = "CONNECTING";
        break;
    case State::kConnected:
        stateString = "CONNECTED";
        break;
    case State::kDisconnected:
        stateString = "DISCONNECTED";
        break;
    }
    return stateString;
}